

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::get(ExclusiveJoinPromiseNode *this,ExceptionOrValue *output)

{
  bool bVar1;
  bool local_3b;
  Fault local_28;
  Fault f;
  bool _kjCondition;
  ExceptionOrValue *output_local;
  ExclusiveJoinPromiseNode *this_local;
  
  f.exception._5_1_ = Branch::get(&this->left,output);
  f.exception._6_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 5));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 6));
  local_3b = true;
  if (!bVar1) {
    local_3b = Branch::get(&this->right,output);
  }
  f.exception._7_1_ = local_3b;
  if (local_3b != false) {
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[27]>
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0xaad,FAILED,"left.get(output) || right.get(output)",
             "_kjCondition,\"get() called before ready.\"",(bool *)((long)&f.exception + 7),
             (char (*) [27])"get() called before ready.");
  Debug::Fault::fatal(&local_28);
}

Assistant:

void ExclusiveJoinPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(left.get(output) || right.get(output), "get() called before ready.");
}